

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::weibull_dist<double>::pdf(weibull_dist<double> *this,result_type_conflict2 x)

{
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar1;
  double __x;
  double dVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 t2;
  result_type_conflict2 t1;
  undefined8 local_8;
  
  if (0.0 <= in_XMM0_Qa) {
    rVar1 = param_type::theta(in_RDI);
    __x = in_XMM0_Qa / rVar1;
    if (__x <= 0.0) {
      rVar1 = param_type::beta(in_RDI);
      if ((rVar1 != 1.0) || (NAN(rVar1))) {
        rVar1 = param_type::beta(in_RDI);
        if (rVar1 <= 1.0) {
          local_8 = std::numeric_limits<double>::quiet_NaN();
        }
        else {
          local_8 = 0.0;
        }
      }
      else {
        rVar1 = param_type::theta(in_RDI);
        local_8 = 1.0 / rVar1;
      }
    }
    else {
      rVar1 = param_type::beta(in_RDI);
      dVar2 = pow(__x,rVar1);
      rVar1 = param_type::beta(in_RDI);
      rVar3 = param_type::theta(in_RDI);
      local_8 = exp(-dVar2);
      local_8 = (rVar1 / rVar3) * (dVar2 / __x) * local_8;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      if (x > 0) {
        const result_type t1{math::pow(x, P.beta())};
        const result_type t2{t1 / x};
        return P.beta() / P.theta() * t2 * math::exp(-t1);
      }
      // x==0
      if (P.beta() == 1)
        return 1 / P.theta();
      if (P.beta() > 1)
        return 0;
      return math::numeric_limits<result_type>::quiet_NaN();
    }